

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_beta_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_encoding cVar1;
  cram_external_type cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  int iVar9;
  size_t __size;
  size_t sVar10;
  undefined1 auVar11 [16];
  double dVar12;
  
  if (prefix == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(prefix);
    uVar6 = b->alloc;
    sVar10 = b->byte;
    if (uVar6 <= sVar10 + __n) {
      do {
        auVar11._8_4_ = (int)(uVar6 >> 0x20);
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = 0x45300000;
        dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar12;
        __size = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar6 == 0) {
          __size = 0x400;
        }
        b->alloc = __size;
        puVar7 = (uchar *)realloc(b->data,__size);
        b->data = puVar7;
        uVar6 = b->alloc;
        sVar10 = b->byte;
      } while (uVar6 <= sVar10 + __n);
    }
    memcpy(b->data + sVar10,prefix,__n);
    b->byte = b->byte + __n;
  }
  iVar3 = itf8_put_blk(b,c->codec);
  cVar1 = (c->field_6).e_byte_array_len.len_encoding;
  iVar9 = 1;
  iVar4 = 1;
  if (((0x7f < cVar1) && (iVar4 = 2, 0x3fff < cVar1)) && (iVar4 = 3, 0x1fffff < cVar1)) {
    iVar4 = 5 - (uint)(cVar1 < 0x10000000);
  }
  cVar2 = (c->field_6).external.type;
  if (((0x7f < cVar2) && (iVar9 = 2, 0x3fff < cVar2)) && (iVar9 = 3, 0x1fffff < cVar2)) {
    iVar9 = 5 - (uint)(cVar2 < 0x10000000);
  }
  iVar4 = itf8_put_blk(b,iVar9 + iVar4);
  iVar9 = itf8_put_blk(b,(c->field_6).huffman.ncodes);
  iVar5 = itf8_put_blk(b,(c->field_6).beta.nbits);
  return iVar5 + iVar9 + iVar4 + iVar3 + (int)__n;
}

Assistant:

int cram_beta_encode_store(cram_codec *c, cram_block *b,
			   char *prefix, int version) {
    int len = 0;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, itf8_size(c->e_beta.offset)
			+ itf8_size(c->e_beta.nbits)); // codec length
    len += itf8_put_blk(b, c->e_beta.offset);
    len += itf8_put_blk(b, c->e_beta.nbits);

    return len;
}